

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

wchar_t assertion_text_file_contents(char *filename,wchar_t line,char *buff,char *fn)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  char *__ptr;
  char *offset;
  char *in_RCX;
  char *in_RDX;
  wchar_t in_ESI;
  char *in_RDI;
  bool bVar3;
  wchar_t s;
  wchar_t n;
  FILE *f;
  char *ftxt;
  char *btxt;
  char *contents;
  char *local_40;
  wchar_t local_4;
  
  assertion_count(in_RDI,in_ESI);
  __stream = fopen(in_RCX,"r");
  if (__stream == (FILE *)0x0) {
    failure_start(in_RDI,(wchar_t)(ulong)(uint)in_ESI,"File doesn\'t exist: %s",in_RCX);
    failure_finish((void *)0x105188);
    local_4 = L'\0';
  }
  else {
    sVar2 = strlen(in_RDX);
    __ptr = (char *)malloc((long)((int)sVar2 * 2 + 0x80));
    sVar2 = fread(__ptr,1,(long)((int)sVar2 * 2 + 0x7f),__stream);
    iVar1 = (int)sVar2;
    if (-1 < iVar1) {
      __ptr[iVar1] = '\0';
    }
    fclose(__stream);
    local_40 = __ptr;
    offset = in_RDX;
    while( true ) {
      bVar3 = false;
      if (*offset != '\0') {
        bVar3 = *local_40 != '\0';
      }
      if (!bVar3) break;
      if (*offset == *local_40) {
        offset = offset + 1;
        local_40 = local_40 + 1;
      }
      else {
        if (((*offset != '\n') || (*local_40 != '\r')) || (local_40[1] != '\n')) break;
        offset = offset + 1;
        local_40 = local_40 + 2;
      }
    }
    if ((*offset == '\0') && (*local_40 == '\0')) {
      free(__ptr);
      local_4 = L'\x01';
    }
    else {
      failure_start(in_RDI,(wchar_t)(ulong)(uint)in_ESI,"Contents don\'t match");
      logprintf("  file=\"%s\"\n",in_RCX);
      if (iVar1 < 1) {
        logprintf("  File empty, contents should be:\n");
        hexdump(in_RDX,in_RCX,(size_t)__ptr,(size_t)offset);
      }
      else {
        hexdump(in_RDX,in_RCX,(size_t)__ptr,(size_t)offset);
        logprintf("  expected\n",in_RCX);
        hexdump(in_RDX,in_RCX,(size_t)__ptr,(size_t)offset);
      }
      failure_finish((void *)0x105397);
      free(__ptr);
      local_4 = L'\0';
    }
  }
  return local_4;
}

Assistant:

int
assertion_text_file_contents(const char *filename, int line, const char *buff, const char *fn)
{
	char *contents;
	const char *btxt, *ftxt;
	FILE *f;
	int n, s;

	assertion_count(filename, line);
	f = fopen(fn, "r");
	if (f == NULL) {
		failure_start(filename, line,
		    "File doesn't exist: %s", fn);
		failure_finish(NULL);
		return (0);
	}
	s = (int)strlen(buff);
	contents = malloc(s * 2 + 128);
	n = (int)fread(contents, 1, s * 2 + 128 - 1, f);
	if (n >= 0)
		contents[n] = '\0';
	fclose(f);
	/* Compare texts. */
	btxt = buff;
	ftxt = (const char *)contents;
	while (*btxt != '\0' && *ftxt != '\0') {
		if (*btxt == *ftxt) {
			++btxt;
			++ftxt;
			continue;
		}
		if (btxt[0] == '\n' && ftxt[0] == '\r' && ftxt[1] == '\n') {
			/* Pass over different new line characters. */
			++btxt;
			ftxt += 2;
			continue;
		}
		break;
	}
	if (*btxt == '\0' && *ftxt == '\0') {
		free(contents);
		return (1);
	}
	failure_start(filename, line, "Contents don't match");
	logprintf("  file=\"%s\"\n", fn);
	if (n > 0) {
		hexdump(contents, buff, n, 0);
		logprintf("  expected\n", fn);
		hexdump(buff, contents, s, 0);
	} else {
		logprintf("  File empty, contents should be:\n");
		hexdump(buff, NULL, s, 0);
	}
	failure_finish(NULL);
	free(contents);
	return (0);
}